

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascFiles.cpp
# Opt level: O1

TCHAR * AppendBlobText(TCHAR *szBuffer,LPBYTE pbData,size_t cbData,TCHAR chSeparator)

{
  long lVar1;
  size_t sVar2;
  
  if (chSeparator != '\0') {
    *szBuffer = chSeparator;
    szBuffer = szBuffer + 1;
  }
  if (cbData != 0) {
    lVar1 = 0;
    sVar2 = 0;
    do {
      szBuffer[sVar2 * 2] = IntToHexChar[pbData[sVar2] >> 4];
      szBuffer[sVar2 * 2 + 1] = IntToHexChar[pbData[sVar2] & 0xf];
      sVar2 = sVar2 + 1;
      lVar1 = lVar1 + -2;
    } while (cbData != sVar2);
    szBuffer = szBuffer + -lVar1;
  }
  *szBuffer = '\0';
  return szBuffer;
}

Assistant:

TCHAR * AppendBlobText(TCHAR * szBuffer, LPBYTE pbData, size_t cbData, TCHAR chSeparator)
{
    // Put the separator, if any
    if(chSeparator != 0)
        *szBuffer++ = chSeparator;

    // Copy the blob data as text
    for(size_t i = 0; i < cbData; i++)
    {
        *szBuffer++ = IntToHexChar[pbData[0] >> 0x04];
        *szBuffer++ = IntToHexChar[pbData[0] & 0x0F];
        pbData++;
    }

    // Terminate the string
    *szBuffer = 0;

    // Return new buffer position
    return szBuffer;
}